

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O0

void opt::registerOptions(Parser *parser)

{
  Parser *pPVar1;
  Option<opt::OutValue> local_b8;
  Option<opt::OutMode> local_80;
  Option<opt::OutFormat> local_48;
  Parser *local_10;
  Parser *parser_local;
  
  local_10 = parser;
  de::cmdline::Option<opt::OutFormat>::Option<2ul>
            (&local_48,"f","format","Output format",&registerOptions::s_outputFormats,"csv");
  pPVar1 = de::cmdline::detail::operator<<(parser,&local_48);
  de::cmdline::Option<opt::OutMode>::Option<2ul>
            (&local_80,"m","mode","Output mode",&registerOptions::s_outputModes,"all");
  pPVar1 = de::cmdline::detail::operator<<(pPVar1,&local_80);
  de::cmdline::Option<opt::OutValue>::Option<2ul>
            (&local_b8,"v","value","Value to extract",&registerOptions::s_outputValues,"code");
  de::cmdline::detail::operator<<(pPVar1,&local_b8);
  return;
}

Assistant:

static void registerOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;
	using de::cmdline::NamedValue;

	static const NamedValue<OutputMode> s_outputModes[] =
	{
		{ "all",	OUTPUTMODE_ALL	},
		{ "diff",	OUTPUTMODE_DIFF	}
	};
	static const NamedValue<OutputFormat> s_outputFormats[] =
	{
		{ "text",	OUTPUTFORMAT_TEXT	},
		{ "csv",	OUTPUTFORMAT_CSV	}
	};
	static const NamedValue<OutputValue> s_outputValues[] =
	{
		{ "code",		OUTPUTVALUE_STATUS_CODE		},
		{ "details",	OUTPUTVALUE_STATUS_DETAILS	}
	};

	parser << Option<OutFormat>		("f",	"format",		"Output format",	s_outputFormats,	"csv")
		   << Option<OutMode>		("m",	"mode",			"Output mode",		s_outputModes,		"all")
		   << Option<OutValue>		("v",	"value",		"Value to extract",	s_outputValues,		"code");
}